

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

string * __thiscall Function::name_abi_cxx11_(string *__return_storage_ptr__,Function *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

std::string Function::name() const {
	return mName;
}